

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void HalfFloatRow_AVX2(uint16_t *src,uint16_t *dst,float scale,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  int iVar3;
  undefined1 (*pauVar4) [32];
  float fVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  fVar5 = scale * 1.92593e-34;
  pauVar4 = (undefined1 (*) [32])src;
  do {
    auVar6 = vpunpckhwd_avx2(*pauVar4,(undefined1  [32])0x0);
    auVar7 = vpunpcklwd_avx2(*pauVar4,(undefined1  [32])0x0);
    auVar6 = vcvtdq2ps_avx(auVar6);
    auVar7 = vcvtdq2ps_avx(auVar7);
    auVar2._4_4_ = fVar5 * auVar6._4_4_;
    auVar2._0_4_ = fVar5 * auVar6._0_4_;
    auVar2._8_4_ = fVar5 * auVar6._8_4_;
    auVar2._12_4_ = fVar5 * auVar6._12_4_;
    auVar2._16_4_ = fVar5 * auVar6._16_4_;
    auVar2._20_4_ = fVar5 * auVar6._20_4_;
    auVar2._24_4_ = fVar5 * auVar6._24_4_;
    auVar2._28_4_ = auVar6._28_4_;
    auVar6._4_4_ = fVar5 * auVar7._4_4_;
    auVar6._0_4_ = fVar5 * auVar7._0_4_;
    auVar6._8_4_ = fVar5 * auVar7._8_4_;
    auVar6._12_4_ = fVar5 * auVar7._12_4_;
    auVar6._16_4_ = fVar5 * auVar7._16_4_;
    auVar6._20_4_ = fVar5 * auVar7._20_4_;
    auVar6._24_4_ = fVar5 * auVar7._24_4_;
    auVar6._28_4_ = auVar7._28_4_;
    auVar7 = vpsrld_avx2(auVar2,0xd);
    auVar6 = vpsrld_avx2(auVar6,0xd);
    auVar6 = vpackssdw_avx2(auVar6,auVar7);
    *(undefined1 (*) [32])((long)pauVar4 + ((long)dst - (long)src)) = auVar6;
    iVar3 = width + -0x10;
    bVar1 = 0xf < width;
    pauVar4 = pauVar4 + 1;
    width = iVar3;
  } while (iVar3 != 0 && bVar1);
  return;
}

Assistant:

void HalfFloatRow_AVX2(const uint16_t* src,
                       uint16_t* dst,
                       float scale,
                       int width) {
  scale *= kScaleBias;
  asm volatile(
      "vbroadcastss %3, %%ymm4                   \n"
      "vpxor       %%ymm5,%%ymm5,%%ymm5          \n"
      "sub         %0,%1                         \n"

      // 16 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm2                   \n"  // 16 shorts
      "add         $0x20,%0                      \n"
      "vpunpckhwd  %%ymm5,%%ymm2,%%ymm3          \n"  // mutates
      "vpunpcklwd  %%ymm5,%%ymm2,%%ymm2          \n"
      "vcvtdq2ps   %%ymm3,%%ymm3                 \n"
      "vcvtdq2ps   %%ymm2,%%ymm2                 \n"
      "vmulps      %%ymm3,%%ymm4,%%ymm3          \n"
      "vmulps      %%ymm2,%%ymm4,%%ymm2          \n"
      "vpsrld      $0xd,%%ymm3,%%ymm3            \n"
      "vpsrld      $0xd,%%ymm2,%%ymm2            \n"
      "vpackssdw   %%ymm3, %%ymm2, %%ymm2        \n"  // unmutates
      "vmovdqu     %%ymm2,-0x20(%0,%1,1)         \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"

      "vzeroupper                                \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
#if defined(__x86_64__)
      : "x"(scale)  // %3
#else
      : "m"(scale)  // %3
#endif
      : "memory", "cc", "xmm2", "xmm3", "xmm4", "xmm5");
}